

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yprp_restr(lys_ypr_ctx_conflict *pctx,lysp_restr *restr,ly_stmt stmt,char *attr,int8_t *flag)

{
  uint16_t *puVar1;
  ly_out *out;
  lysp_ext_instance *plVar2;
  lysp_restr *plVar3;
  char *pcVar4;
  lysp_ext_instance *plVar5;
  lysp_ext_instance *ext;
  uint uVar6;
  uint64_t u;
  lysp_ext_instance *plVar7;
  int8_t inner_flag;
  int8_t local_39;
  lysp_restr *local_38;
  
  local_39 = '\0';
  if (restr != (lysp_restr *)0x0) {
    out = (pctx->field_0).field_0.out;
    uVar6 = 0;
    if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
        (undefined1  [24])0x0) {
      uVar6 = (uint)(pctx->field_0).field_0.level * 2;
    }
    pcVar4 = lyplg_ext_stmt2str(stmt);
    ly_print_(out,"%*s<%s %s=\"",(ulong)uVar6,"",pcVar4,attr);
    pcVar4 = (restr->arg).str;
    if ((*pcVar4 == '\x15') || (*pcVar4 == '\x06')) {
      pcVar4 = pcVar4 + 1;
    }
    lyxml_dump_text((pctx->field_0).field_0.out,pcVar4,'\x01');
    plVar7 = (lysp_ext_instance *)0x0;
    ly_print_((pctx->field_0).field_0.out,"\"");
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    plVar2 = restr->exts;
    ext = plVar2;
    local_38 = restr;
    while( true ) {
      plVar3 = local_38;
      if (plVar2 == (lysp_ext_instance *)0x0) {
        plVar5 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar5 = plVar2[-1].exts;
      }
      if (plVar5 <= plVar7) break;
      yprp_extension_instance(pctx,stmt,'\0',ext,&local_39);
      plVar7 = (lysp_ext_instance *)((long)&plVar7->name + 1);
      ext = ext + 1;
    }
    if (*(local_38->arg).str == '\x15') {
      if (local_39 == '\0') {
        local_39 = '\x01';
        ly_print_((pctx->field_0).field_0.out,">\n");
      }
      ypr_substmt(pctx,LY_STMT_MODIFIER,'\0',"invert-match",plVar3->exts);
    }
    pcVar4 = plVar3->emsg;
    if (pcVar4 != (char *)0x0) {
      if (local_39 == '\0') {
        local_39 = '\x01';
        ly_print_((pctx->field_0).field_0.out,">\n");
        pcVar4 = plVar3->emsg;
      }
      ypr_substmt(pctx,LY_STMT_ERROR_MESSAGE,'\0',pcVar4,plVar3->exts);
    }
    pcVar4 = plVar3->eapptag;
    if (pcVar4 != (char *)0x0) {
      if (local_39 == '\0') {
        local_39 = '\x01';
        ly_print_((pctx->field_0).field_0.out,">\n");
        pcVar4 = plVar3->eapptag;
      }
      ypr_substmt(pctx,LY_STMT_ERROR_APP_TAG,'\0',pcVar4,plVar3->exts);
    }
    ypr_description(pctx,plVar3->dsc,plVar3->exts,&local_39);
    ypr_reference(pctx,plVar3->ref,plVar3->exts,&local_39);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar4 = lyplg_ext_stmt2str(stmt);
    ypr_close(pctx,pcVar4,local_39);
  }
  return;
}

Assistant:

static void
yprp_restr(struct lys_ypr_ctx *pctx, const struct lysp_restr *restr, enum ly_stmt stmt, ly_bool *flag)
{
    ly_bool inner_flag = 0;
    const char *text;
    uint16_t flags = 0;

    if (!restr) {
        return;
    }

    ypr_open(pctx->out, flag);
    text = ((restr->arg.str[0] != LYSP_RESTR_PATTERN_NACK) && (restr->arg.str[0] != LYSP_RESTR_PATTERN_ACK)) ?
            restr->arg.str : restr->arg.str + 1;
    if (!strchr(text, '\n')) {
        flags |= LYS_YPR_TEXT_SINGLELINE;
    }
    if (restr->arg.flags & LYS_SINGLEQUOTED) {
        flags |= LYS_YPR_TEXT_SINGLEQUOTED;
    }
    ypr_text(pctx, lyplg_ext_stmt2str(stmt), text, flags);

    LEVEL++;
    yprp_extension_instances(pctx, stmt, 0, restr->exts, &inner_flag);
    if (restr->arg.str[0] == LYSP_RESTR_PATTERN_NACK) {
        /* special byte value in pattern's expression: 0x15 - invert-match, 0x06 - match */
        ypr_open(pctx->out, &inner_flag);
        ypr_substmt(pctx, LY_STMT_MODIFIER, 0, "invert-match", 0, restr->exts);
    }
    if (restr->emsg) {
        ypr_open(pctx->out, &inner_flag);
        ypr_substmt(pctx, LY_STMT_ERROR_MESSAGE, 0, restr->emsg, 0, restr->exts);
    }
    if (restr->eapptag) {
        ypr_open(pctx->out, &inner_flag);
        ypr_substmt(pctx, LY_STMT_ERROR_APP_TAG, 0, restr->eapptag, 0, restr->exts);
    }
    ypr_description(pctx, restr->dsc, restr->exts, &inner_flag);
    ypr_reference(pctx, restr->ref, restr->exts, &inner_flag);

    LEVEL--;
    ypr_close(pctx, inner_flag);
}